

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment.cpp
# Opt level: O3

size_t __thiscall pstore::repo::fragment::size_bytes(fragment *this)

{
  value_type_conflict2 vVar1;
  uint uVar2;
  const_reference pvVar3;
  long lVar4;
  size_t sVar5;
  dispatcher_buffer buffer;
  not_null<std::aligned_storage<16UL,_8UL>::type_*> local_48;
  long *local_40;
  type local_38;
  
  if ((this->arr_).sa_.bitmap_ == 0) {
    sVar5 = 0x20;
  }
  else {
    pvVar3 = sparse_array<unsigned_long,_unsigned_int>::back(&(this->arr_).sa_);
    vVar1 = *pvVar3;
    local_38._0_4_ = (this->arr_).sa_.bitmap_;
    uVar2 = sparse_array<unsigned_long,_unsigned_int>::indices::back((indices *)&local_38.__align);
    local_48.ptr_ = &local_38;
    gsl::not_null<std::aligned_storage<16UL,_8UL>::type_*>::ensure_invariant(&local_48);
    anon_unknown.dwarf_1d02f7::make_dispatcher
              ((anon_unknown_dwarf_1d02f7 *)&local_40,this,(section_kind)uVar2,local_48);
    lVar4 = (**(code **)(*local_40 + 0x10))();
    sVar5 = lVar4 + vVar1;
  }
  return sVar5;
}

Assistant:

std::size_t fragment::size_bytes () const {
    if (arr_.size () == 0) {
        return sizeof (*this);
    }
    auto const last_offset = arr_.back ();
    auto const last_section_kind = static_cast<section_kind> (arr_.get_indices ().back ());
    dispatcher_buffer buffer;
    auto const last_section_size =
        make_dispatcher (*this, last_section_kind, &buffer)->size_bytes ();
    return last_offset + last_section_size;
}